

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::makeTemperamentPythagorean
          (MidiMessage *this,int referencePitchClass,int channelMask)

{
  allocator_type local_39;
  vector<double,_std::allocator<double>_> temperament;
  
  std::vector<double,_std::allocator<double>_>::vector(&temperament,0xc,&local_39);
  *(undefined4 *)
   temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0;
  *(undefined4 *)
   ((long)temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   (temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start + 1) = 0x5dfce840;
  *(undefined4 *)
   ((long)temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + 0xc) = 0xc0238ccd;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 3.910001730774866;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = -5.865002596162299;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[8] = -7.820003461549732;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[9] = 5.865002596162299;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[4] = 7.820003461549732;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[5] = -1.955000865387433;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[10] = -3.910001730774866;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[0xb] = 9.775004326937164;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[6] = 11.730005192324597;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = 1.955000865387433;
  makeMts9_TemperamentByCentsDeviationFromET(this,&temperament,referencePitchClass,channelMask);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temperament.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void MidiMessage::makeTemperamentPythagorean(int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12);
	double x = 1200.0 * log2(3.0 / 2.0);
	temperament[1]  = x * -5 + 3500; // -9.775 cents
	temperament[8]  = x * -4 + 2800; // -7.820 cents
	temperament[3]  = x * -3 + 2100; // -5.865 cents
	temperament[10] = x * -2 + 1400; // -3.910 cents
	temperament[5]  = x * -1 + 700;  // -1.955 cents
	temperament[0]  = 0.0;           //  0     cents
	temperament[7]  = x * 1 - 700;   //  1.955 cents
	temperament[2]  = x * 2 - 1400;  //  3.910 cents
	temperament[9]  = x * 3 - 2100;  //  5.865 cents
	temperament[4]  = x * 4 - 2800;  //  7.820 cents
	temperament[11] = x * 5 - 3500;  //  9.775 cents
	temperament[6]  = x * 6 - 4200;  // 11.730 cents
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}